

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_set_page_with_attrs_m68k
               (CPUState *cpu,target_ulong_conflict vaddr,hwaddr paddr,MemTxAttrs attrs,int prot,
               int mmu_idx,target_ulong_conflict size)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  CPUArchState_conflict3 *pCVar4;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  MemoryRegion_conflict *pMVar9;
  FlatView *pFVar10;
  MemoryListener *pMVar11;
  QTailQLink *pQVar12;
  QTailQLink *pQVar13;
  _Bool _Var14;
  int asidx;
  target_ulong_conflict tVar15;
  uint uVar16;
  uint uVar17;
  MemoryRegionSection *section;
  void *pvVar18;
  ram_addr_t rVar19;
  hwaddr hVar20;
  uint uVar21;
  ulong uVar22;
  target_ulong_conflict page;
  uc_struct_conflict3 *uc;
  uc_arch uVar23;
  long lVar24;
  uc_arch uVar25;
  MemTxAttrs in_stack_ffffffffffffff68;
  uc_arch local_90;
  int prot_local;
  hwaddr xlat;
  MemTxAttrs local_7c;
  long local_78;
  ulong local_70;
  long local_68;
  CPUArchState_conflict3 *local_60;
  uint *local_58;
  long local_50;
  FPReg_conflict *local_48;
  ulong local_40;
  ulong local_38;
  
  pCVar4 = (CPUArchState_conflict3 *)cpu->env_ptr;
  p_Var5 = cpu->cc->asidx_from_attrs;
  prot_local = prot;
  if (p_Var5 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    asidx = 0;
  }
  else {
    asidx = (*p_Var5)((CPUState_conflict *)cpu,in_stack_ffffffffffffff68);
    if ((asidx < 0) || (cpu->num_ases <= asidx)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  local_48 = pCVar4[-3].fregs + 6;
  local_68 = (long)mmu_idx;
  local_50 = local_68 * 0x2b0;
  local_58 = (uint *)((long)pCVar4 + local_50 + -0x590);
  local_38 = 0x1000;
  if (0x1000 < size) {
    uVar16 = *local_58;
    uVar21 = -size;
    tVar15 = vaddr;
    if (uVar16 != 0xffffffff) {
      uVar17 = uVar21 & *(uint *)((long)pCVar4 + local_50 + -0x58c);
      do {
        uVar21 = uVar17;
        tVar15 = uVar16;
        uVar17 = uVar21 * 2;
      } while ((uVar21 & (uVar16 ^ vaddr)) != 0);
    }
    *local_58 = tVar15 & uVar21;
    *(uint *)((long)pCVar4 + local_50 + -0x58c) = uVar21;
    local_38 = (ulong)size;
  }
  local_40 = (ulong)((uint)paddr & 0xfffff000);
  local_60 = pCVar4;
  section = address_space_translate_for_iotlb_m68k
                      (cpu,asidx,local_40,&xlat,&local_38,attrs,&prot_local);
  if (0xfff < local_38) {
    uVar23 = vaddr & 0xfffff000;
    uVar25 = uVar23 | 0x800;
    if (0xfff < size) {
      uVar25 = uVar23;
    }
    uVar25 = (uint)attrs >> 0xc & 0x80 | uVar25;
    local_7c = attrs;
    if (section->mr->ram == true) {
      pvVar18 = memory_region_get_ram_ptr_m68k(section->mr);
      local_78 = (long)pvVar18 + xlat;
      rVar19 = memory_region_get_ram_addr_m68k(section->mr);
      lVar24 = rVar19 + xlat;
      local_90 = uVar25;
      if ((prot_local & 2U) != 0) {
        if (section->readonly == true) {
          local_90 = uVar25 | 0x40;
        }
        else {
          local_90 = uVar25 | 0x400;
        }
      }
    }
    else {
      hVar20 = memory_region_section_get_iotlb_m68k(cpu,section);
      lVar24 = hVar20 + xlat;
      uVar25 = uVar25 | 0x200;
      local_78 = 0;
      local_90 = uVar25;
    }
    local_70 = (ulong)uVar23;
    uVar16 = cpu_watchpoint_address_matches_m68k(cpu,local_70,0x1000);
    uVar21 = vaddr >> 0xc & local_60->dregs[local_68 * 4 + -0xc] >> 6;
    uc = (uc_struct_conflict3 *)
         ((ulong)(uVar21 << 6) + *(long *)(local_60->dregs + local_68 * 4 + -10));
    *(ushort *)(local_60[-3].fregs + 4) =
         *(ushort *)(local_60[-3].fregs + 4) | (ushort)(1 << ((byte)local_68 & 0x1f));
    tlb_flush_vtlb_page_locked(local_60,(int)local_68,uVar23);
    _Var14 = tlb_hit_page_anyprot(uc,(CPUTLBEntry *)(ulong)uVar23,page);
    if ((!_Var14) &&
       (((uc->arch != 0xffffffff || (uc->mode != ~UC_MODE_ARM)) || (uc->errnum != ~UC_ERR_OK)))) {
      lVar6 = *(long *)(local_58 + 8);
      *(long *)(local_58 + 8) = lVar6 + 1;
      uVar17 = (uint)lVar6 & 7;
      uVar22 = (ulong)(uVar17 << 6);
      uVar7 = *(undefined8 *)uc;
      uVar8 = *(undefined8 *)&uc->errnum;
      pMVar9 = (uc->address_space_memory).root;
      pFVar10 = (uc->address_space_memory).current_map;
      pMVar11 = (uc->address_space_memory).listeners.tqh_first;
      pQVar12 = (uc->address_space_memory).listeners.tqh_circ.tql_prev;
      pQVar13 = (uc->address_space_memory).address_spaces_link.tqe_circ.tql_prev;
      puVar1 = (undefined8 *)((long)local_58 + uVar22 + 0x58);
      *puVar1 = (uc->address_space_memory).address_spaces_link.tqe_next;
      puVar1[1] = pQVar13;
      puVar1 = (undefined8 *)((long)local_58 + uVar22 + 0x48);
      *puVar1 = pMVar11;
      puVar1[1] = pQVar12;
      puVar1 = (undefined8 *)((long)local_58 + uVar22 + 0x38);
      *puVar1 = pMVar9;
      puVar1[1] = pFVar10;
      puVar1 = (undefined8 *)((long)local_58 + uVar22 + 0x28);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      puVar1 = (undefined8 *)(*(long *)(local_58 + 0xaa) + (ulong)(uVar21 << 4));
      uVar7 = puVar1[1];
      puVar3 = (undefined8 *)((long)local_58 + (ulong)(uVar17 << 4) + 0x228);
      *puVar3 = *puVar1;
      puVar3[1] = uVar7;
      plVar2 = (long *)((long)local_48 + local_50 + 0x18);
      *plVar2 = *plVar2 + -1;
    }
    lVar6 = *(long *)(local_58 + 0xaa);
    *(ulong *)(lVar6 + (ulong)(uVar21 << 4)) = lVar24 - local_70;
    *(MemTxAttrs *)(lVar6 + 8 + (ulong)(uVar21 << 4)) = local_7c;
    if ((prot_local & 2U) == 0) {
      uVar23 = 0xffffffff;
    }
    else {
      uVar23 = (uVar16 & 2) << 7 | local_90 | (prot_local & 0x40U) << 5;
    }
    uc->arch = -(uint)((prot_local & 1U) == 0) | (uVar16 & 1) << 8 | uVar25;
    uc->mode = uVar23;
    uc->errnum = -(uint)((prot_local & 4U) == 0) | uVar25;
    *(int *)&uc->field_0xc = (int)local_40;
    (uc->address_space_memory).root = (MemoryRegion_conflict *)(local_78 - local_70);
    plVar2 = (long *)((long)local_48 + local_50 + 0x18);
    *plVar2 = *plVar2 + 1;
    return;
  }
  __assert_fail("sz >= TARGET_PAGE_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                ,0x322,
                "void tlb_set_page_with_attrs_m68k(CPUState *, target_ulong, hwaddr, MemTxAttrs, int, int, target_ulong)"
               );
}

Assistant:

void tlb_set_page_with_attrs(CPUState *cpu, target_ulong vaddr,
                             hwaddr paddr, MemTxAttrs attrs, int prot,
                             int mmu_idx, target_ulong size)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    CPUTLB *tlb = env_tlb(env);
    CPUTLBDesc *desc = &tlb->d[mmu_idx];
    MemoryRegionSection *section;
    unsigned int index;
    target_ulong address;
    target_ulong write_address;
    uintptr_t addend;
    CPUTLBEntry *te, tn;
    hwaddr iotlb, xlat, sz, paddr_page;
    target_ulong vaddr_page;
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    int wp_flags;
    bool is_ram;

    // assert_cpu_is_self(cpu);

    if (size <= TARGET_PAGE_SIZE) {
        sz = TARGET_PAGE_SIZE;
    } else {
        tlb_add_large_page(env, mmu_idx, vaddr, size);
        sz = size;
    }
    vaddr_page = vaddr & TARGET_PAGE_MASK;
    paddr_page = paddr & TARGET_PAGE_MASK;

    section = address_space_translate_for_iotlb(cpu, asidx, paddr_page,
                                                &xlat, &sz, attrs, &prot);
    assert(sz >= TARGET_PAGE_SIZE);

    address = vaddr_page;
    if (size < TARGET_PAGE_SIZE) {
        /* Repeat the MMU check and TLB fill on every access.  */
        address |= TLB_INVALID_MASK;
    }
    if (attrs.byte_swap) {
        address |= TLB_BSWAP;
    }

    is_ram = memory_region_is_ram(section->mr);
    // is_romd = memory_region_is_romd(section->mr);

    if (is_ram) {
        /* RAM and ROMD both have associated host memory. */
        addend = (uintptr_t)memory_region_get_ram_ptr(section->mr) + xlat;
    } else {
        /* I/O does not; force the host address to NULL. */
        addend = 0;
    }

    write_address = address;
    if (is_ram) {
        iotlb = memory_region_get_ram_addr(section->mr) + xlat;
        /*
         * Computing is_clean is expensive; avoid all that unless
         * the page is actually writable.
         */
        if (prot & PAGE_WRITE) {
            if (section->readonly) {
                write_address |= TLB_DISCARD_WRITE;
            } else if (cpu_physical_memory_is_clean(iotlb)) {
                write_address |= TLB_NOTDIRTY;
            }
        }
    } else {
        /* I/O or ROMD */
        iotlb = memory_region_section_get_iotlb(cpu, section) + xlat;
        /*
         * Writes to romd devices must go through MMIO to enable write.
         * Reads to romd devices go through the ram_ptr found above,
         * but of course reads to I/O must go through MMIO.
         */
        write_address |= TLB_MMIO;
        //if (!is_romd) {
            address = write_address;
        //}
    }

    wp_flags = cpu_watchpoint_address_matches(cpu, vaddr_page,
                                              TARGET_PAGE_SIZE);

    index = tlb_index(env, mmu_idx, vaddr_page);
    te = tlb_entry(env, mmu_idx, vaddr_page);

    /* Note that the tlb is no longer clean.  */
    tlb->c.dirty |= 1 << mmu_idx;

    /* Make sure there's no cached translation for the new page.  */
    tlb_flush_vtlb_page_locked(env, mmu_idx, vaddr_page);

    /*
     * Only evict the old entry to the victim tlb if it's for a
     * different page; otherwise just overwrite the stale data.
     */
    if (!tlb_hit_page_anyprot(env->uc, te, vaddr_page) && !tlb_entry_is_empty(te)) {
        unsigned vidx = desc->vindex++ % CPU_VTLB_SIZE;
        CPUTLBEntry *tv = &desc->vtable[vidx];

        /* Evict the old entry into the victim tlb.  */
        copy_tlb_helper_locked(tv, te);
        desc->viotlb[vidx] = desc->iotlb[index];
        tlb_n_used_entries_dec(env, mmu_idx);
    }

    /* refill the tlb */
    /*
     * At this point iotlb contains a physical section number in the lower
     * TARGET_PAGE_BITS, and either
     *  + the ram_addr_t of the page base of the target RAM (RAM)
     *  + the offset within section->mr of the page base (I/O, ROMD)
     * We subtract the vaddr_page (which is page aligned and thus won't
     * disturb the low bits) to give an offset which can be added to the
     * (non-page-aligned) vaddr of the eventual memory access to get
     * the MemoryRegion offset for the access. Note that the vaddr we
     * subtract here is that of the page base, and not the same as the
     * vaddr we add back in io_readx()/io_writex()/get_page_addr_code().
     */
    desc->iotlb[index].addr = iotlb - vaddr_page;
    desc->iotlb[index].attrs = attrs;

    /* Now calculate the new entry */
    tn.addend = addend - vaddr_page;
    tn.paddr = paddr_page;
    if (prot & PAGE_READ) {
        tn.addr_read = address;
        if (wp_flags & BP_MEM_READ) {
            tn.addr_read |= TLB_WATCHPOINT;
        }
    } else {
        tn.addr_read = -1;
    }

    if (prot & PAGE_EXEC) {
        tn.addr_code = address;
    } else {
        tn.addr_code = -1;
    }

    tn.addr_write = -1;
    if (prot & PAGE_WRITE) {
        tn.addr_write = write_address;
        if (prot & PAGE_WRITE_INV) {
            tn.addr_write |= TLB_INVALID_MASK;
        }
        if (wp_flags & BP_MEM_WRITE) {
            tn.addr_write |= TLB_WATCHPOINT;
        }
    }

    copy_tlb_helper_locked(te, &tn);
    tlb_n_used_entries_inc(env, mmu_idx);
}